

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O3

bool __thiscall Quest_Context::CheckRule(Quest_Context *this,Expression *expr)

{
  byte bVar1;
  Gender GVar2;
  pointer pcVar3;
  _Map_pointer ppvVar4;
  Character *pCVar5;
  size_t __n;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  short sVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  time_t tVar13;
  ushort *puVar14;
  mapped_type *pmVar15;
  size_type sVar16;
  int *piVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
  *this_00;
  _Elt_pointer pvVar22;
  _Elt_pointer pbVar23;
  long *plVar24;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  string function_name;
  allocator_type local_1c1;
  long *local_1c0 [2];
  long local_1b0 [2];
  undefined1 local_1a0 [32];
  string local_180;
  _Elt_pointer local_160 [2];
  undefined1 local_150 [48];
  string local_120;
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  long *local_e0 [2];
  long local_d0 [2];
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  string local_70;
  string local_50;
  
  if ((this->quest->quest->info).disabled != false) {
    return false;
  }
  local_1c0[0] = local_1b0;
  pcVar3 = (expr->function)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c0,pcVar3,pcVar3 + (expr->function)._M_string_length);
  iVar10 = std::__cxx11::string::compare((char *)local_1c0);
  bVar8 = true;
  if (iVar10 == 0) goto LAB_0018872d;
  iVar10 = std::__cxx11::string::compare((char *)local_1c0);
  if (iVar10 == 0) {
    pcVar3 = local_1a0 + 0x10;
    local_1a0._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"d","");
    this_00 = &this->progress;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
              ::operator[](this_00,(key_type *)local_1a0);
    sVar9 = *pmVar15;
    tVar13 = time((time_t *)0x0);
    if ((pointer)local_1a0._0_8_ != pcVar3) {
      operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
    }
    if ((((uint)(SUB168(SEXT816(tVar13) * SEXT816(0x1845c8a0ce512957),8) >> 0xd) & 0x7ffff) -
         (SUB164(SEXT816(tVar13) * SEXT816(0x1845c8a0ce512957),0xc) >> 0x1f) & 0x7fff) != (int)sVar9
       ) {
      tVar13 = time((time_t *)0x0);
      local_1a0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"d","");
      puVar14 = (ushort *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                ::operator[](this_00,(key_type *)local_1a0);
      *puVar14 = (short)(SUB168(SEXT816(tVar13) * SEXT816(0x1845c8a0ce512957),8) >> 0xd) -
                 (SUB162(SEXT816(tVar13) * SEXT816(0x1845c8a0ce512957),0xe) >> 0xf) & 0x7fff;
      if ((pointer)local_1a0._0_8_ != pcVar3) {
        operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
      }
      local_1a0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"c","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                ::operator[](this_00,(key_type *)local_1a0);
      *pmVar15 = 0;
      if ((pointer)local_1a0._0_8_ != pcVar3) {
        operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
      }
LAB_00187fcb:
      bVar8 = false;
      goto LAB_0018872d;
    }
    local_1a0._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"c","");
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
              ::operator[](this_00,(key_type *)local_1a0);
    pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    lVar19 = (long)pvVar22 -
             (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_first;
    uVar18 = lVar19 >> 6;
    if ((long)uVar18 < 0) {
      uVar20 = lVar19 >> 9;
LAB_00188090:
      pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
    }
    else if (7 < uVar18) {
      uVar20 = uVar18 >> 3;
      goto LAB_00188090;
    }
    sVar9 = *pmVar15;
    iVar10 = util::variant::GetInt(pvVar22);
    bVar8 = iVar10 <= sVar9;
    local_50._M_dataplus._M_p = (pointer)local_1a0._0_8_;
    if ((pointer)local_1a0._0_8_ == pcVar3) goto LAB_0018872d;
LAB_001880c3:
    operator_delete(local_50._M_dataplus._M_p,local_1a0._16_8_ + 1);
    goto LAB_0018872d;
  }
  iVar10 = std::__cxx11::string::compare((char *)local_1c0);
  if (iVar10 == 0) {
    pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    lVar19 = (long)pvVar22 -
             (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_first;
    uVar18 = lVar19 >> 6;
    if ((long)uVar18 < 0) {
      uVar20 = lVar19 >> 9;
LAB_00188062:
      pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
    }
    else if (7 < uVar18) {
      uVar20 = uVar18 >> 3;
      goto LAB_00188062;
    }
    uVar21 = (uint)this->character->map->id;
    uVar11 = util::variant::GetInt(pvVar22);
  }
  else {
    iVar10 = std::__cxx11::string::compare((char *)local_1c0);
    if (iVar10 != 0) {
      iVar10 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar10 == 0) {
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar18 = lVar19 >> 6;
        if ((long)uVar18 < 0) {
          uVar20 = lVar19 >> 9;
LAB_001881d1:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_001881d1;
        }
        uVar21 = (uint)this->character->map->id;
        uVar11 = util::variant::GetInt(pvVar22);
LAB_001881f0:
        bVar8 = uVar11 == uVar21;
LAB_001881f2:
        bVar8 = !bVar8;
        goto LAB_0018872d;
      }
      iVar10 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar10 == 0) {
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar18 = lVar19 >> 6;
        if ((long)uVar18 < 0) {
          uVar20 = lVar19 >> 9;
LAB_0018823a:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_0018823a;
        }
        sVar9 = this->character->map->id;
        iVar10 = util::variant::GetInt(pvVar22);
        if (iVar10 != sVar9) goto LAB_0018872d;
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 6;
        uVar18 = lVar19 + 1;
        if (lVar19 < -1) {
          uVar20 = (long)uVar18 >> 3;
LAB_001884f7:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else {
          if (7 < uVar18) {
            uVar20 = uVar18 >> 3;
            goto LAB_001884f7;
          }
          pvVar22 = pvVar22 + 1;
        }
        bVar1 = this->character->x;
        uVar11 = util::variant::GetInt(pvVar22);
        if (uVar11 != bVar1) goto LAB_0018872d;
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 6;
        uVar18 = lVar19 + 2;
        if (lVar19 < -2) {
          uVar20 = (long)uVar18 >> 3;
LAB_0018866f:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else {
          if (7 < uVar18) {
            uVar20 = uVar18 >> 3;
            goto LAB_0018866f;
          }
          pvVar22 = pvVar22 + 2;
        }
        uVar21 = (uint)this->character->y;
        uVar11 = util::variant::GetInt(pvVar22);
        goto LAB_001881f0;
      }
      iVar10 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar10 == 0) {
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar18 = lVar19 >> 6;
        if ((long)uVar18 < 0) {
          uVar20 = lVar19 >> 9;
LAB_0018836c:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_0018836c;
        }
        pCVar5 = this->character;
        iVar10 = util::variant::GetInt(pvVar22);
        iVar10 = Character::HasItem(pCVar5,(short)iVar10,false);
        sVar16 = std::deque<util::variant,_std::allocator<util::variant>_>::size(&expr->args);
        iVar12 = 1;
        if (1 < sVar16) {
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          lVar19 = (long)pvVar22 -
                   (long)(expr->args).
                         super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                         super__Deque_impl_data._M_start._M_first >> 6;
          uVar18 = lVar19 + 1;
          if (lVar19 < -1) {
            uVar20 = (long)uVar18 >> 3;
LAB_00188645:
            pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8
            ;
          }
          else {
            if (7 < uVar18) {
              uVar20 = uVar18 >> 3;
              goto LAB_00188645;
            }
            pvVar22 = pvVar22 + 1;
          }
          iVar12 = util::variant::GetInt(pvVar22);
        }
        bVar8 = iVar12 <= iVar10;
        goto LAB_0018872d;
      }
      iVar10 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar10 == 0) {
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar18 = lVar19 >> 6;
        if ((long)uVar18 < 0) {
          uVar20 = lVar19 >> 9;
LAB_00188467:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_00188467;
        }
        pCVar5 = this->character;
        iVar10 = util::variant::GetInt(pvVar22);
        iVar10 = Character::HasItem(pCVar5,(short)iVar10,false);
        sVar16 = std::deque<util::variant,_std::allocator<util::variant>_>::size(&expr->args);
        iVar12 = 1;
        if (1 < sVar16) {
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          lVar19 = (long)pvVar22 -
                   (long)(expr->args).
                         super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                         super__Deque_impl_data._M_start._M_first >> 6;
          uVar18 = lVar19 + 1;
          if (lVar19 < -1) {
            uVar20 = (long)uVar18 >> 3;
LAB_0018870f:
            pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8
            ;
          }
          else {
            if (7 < uVar18) {
              uVar20 = uVar18 >> 3;
              goto LAB_0018870f;
            }
            pvVar22 = pvVar22 + 1;
          }
          iVar12 = util::variant::GetInt(pvVar22);
        }
        bVar8 = iVar10 < iVar12;
        goto LAB_0018872d;
      }
      iVar10 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar10 == 0) {
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar18 = lVar19 >> 6;
        if ((long)uVar18 < 0) {
          uVar20 = lVar19 >> 9;
LAB_001885bb:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_001885bb;
        }
        pCVar5 = this->character;
        iVar10 = util::variant::GetInt(pvVar22);
        bVar7 = Character::HasSpell(pCVar5,(short)iVar10);
        if (bVar7) {
          sVar16 = std::deque<util::variant,_std::allocator<util::variant>_>::size(&expr->args);
          if (sVar16 < 2) goto LAB_0018872d;
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          lVar19 = (long)pvVar22 -
                   (long)(expr->args).
                         super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                         super__Deque_impl_data._M_start._M_first;
          uVar18 = lVar19 >> 6;
          if ((long)uVar18 < 0) {
            uVar20 = lVar19 >> 9;
LAB_00188802:
            pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8
            ;
          }
          else if (7 < uVar18) {
            uVar20 = uVar18 >> 3;
            goto LAB_00188802;
          }
          pCVar5 = this->character;
          iVar10 = util::variant::GetInt(pvVar22);
          sVar9 = Character::SpellLevel(pCVar5,(short)iVar10);
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          lVar19 = (long)pvVar22 -
                   (long)(expr->args).
                         super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                         super__Deque_impl_data._M_start._M_first >> 6;
          uVar18 = lVar19 + 1;
          if (lVar19 < -1) {
            uVar20 = (long)uVar18 >> 3;
LAB_0018889e:
            pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8
            ;
          }
          else {
            if (7 < uVar18) {
              uVar20 = uVar18 >> 3;
              goto LAB_0018889e;
            }
            pvVar22 = pvVar22 + 1;
          }
          iVar10 = util::variant::GetInt(pvVar22);
          bVar8 = iVar10 <= sVar9;
          goto LAB_0018872d;
        }
        goto LAB_00188637;
      }
      iVar10 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar10 == 0) {
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar18 = lVar19 >> 6;
        if ((long)uVar18 < 0) {
          uVar20 = lVar19 >> 9;
LAB_001886d6:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_001886d6;
        }
        pCVar5 = this->character;
        iVar10 = util::variant::GetInt(pvVar22);
        bVar8 = Character::HasSpell(pCVar5,(short)iVar10);
        bVar8 = !bVar8;
        goto LAB_0018872d;
      }
      iVar10 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar10 == 0) {
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar18 = lVar19 >> 6;
        if ((long)uVar18 < 0) {
          uVar20 = lVar19 >> 9;
LAB_0018879b:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_0018879b;
        }
        GVar2 = this->character->gender;
        iVar10 = util::variant::GetInt(pvVar22);
        bVar8 = GVar2 == (Gender)iVar10;
        goto LAB_0018872d;
      }
      iVar10 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar10 == 0) {
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar18 = lVar19 >> 6;
        if ((long)uVar18 < 0) {
          uVar20 = lVar19 >> 9;
LAB_00188870:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_00188870;
        }
        uVar21 = (uint)this->character->clas;
        uVar11 = util::variant::GetInt(pvVar22);
        goto LAB_00188081;
      }
      iVar10 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar10 == 0) {
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar18 = lVar19 >> 6;
        if ((long)uVar18 < 0) {
          uVar20 = lVar19 >> 9;
LAB_00188903:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_00188903;
        }
        uVar21 = (uint)this->character->race;
        uVar11 = util::variant::GetInt(pvVar22);
        goto LAB_00188081;
      }
      iVar10 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar10 == 0) {
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar18 = lVar19 >> 6;
        if ((long)uVar18 < 0) {
          uVar20 = lVar19 >> 9;
LAB_001889ce:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_001889ce;
        }
        pCVar5 = this->character;
        iVar10 = util::variant::GetInt(pvVar22);
        local_1a0._0_4_ = iVar10;
        piVar17 = std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                            (&pCVar5->paperdoll,&pCVar5->cosmetic_paperdoll);
        bVar8 = (array<int,_15UL> *)piVar17 == &this->character->cosmetic_paperdoll;
        goto LAB_001881f2;
      }
      iVar10 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar10 == 0) {
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar18 = lVar19 >> 6;
        if ((long)uVar18 < 0) {
          uVar20 = lVar19 >> 9;
LAB_00188a5f:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_00188a5f;
        }
        pCVar5 = this->character;
        util::variant::GetString_abi_cxx11_((string *)local_1a0,pvVar22);
        uVar6 = local_1a0._0_8_;
        __n = (pCVar5->home)._M_string_length;
        if (__n == local_1a0._8_8_) {
          if (__n == 0) {
            bVar8 = true;
          }
          else {
            iVar10 = bcmp((pCVar5->home)._M_dataplus._M_p,(void *)local_1a0._0_8_,__n);
            bVar8 = iVar10 == 0;
          }
        }
        else {
          bVar8 = false;
        }
        if ((undefined1 *)uVar6 != local_1a0 + 0x10) {
          operator_delete((void *)uVar6,local_1a0._16_8_ + 1);
        }
        goto LAB_0018872d;
      }
      iVar10 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar10 == 0) {
        local_1a0._0_8_ = local_1a0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"r","");
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                  ::operator[](&this->progress,(key_type *)local_1a0);
        iVar10 = (int)*pmVar15;
        if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
          operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
        }
        sVar16 = std::deque<util::variant,_std::allocator<util::variant>_>::size(&expr->args);
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        ppvVar4 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node;
        uVar18 = lVar19 >> 6;
        uVar20 = lVar19 >> 9;
        if (1 < sVar16) {
          if ((long)uVar18 < 0) {
LAB_00188bc4:
            pvVar22 = ppvVar4[uVar20] + uVar18 + uVar20 * -8;
          }
          else if (7 < uVar18) {
            uVar20 = uVar18 >> 3;
            goto LAB_00188bc4;
          }
          iVar12 = util::variant::GetInt(pvVar22);
          if (iVar10 < iVar12) goto LAB_00187fcb;
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          lVar19 = (long)pvVar22 -
                   (long)(expr->args).
                         super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                         super__Deque_impl_data._M_start._M_first >> 6;
          uVar18 = lVar19 + 1;
          if (lVar19 < -1) {
            uVar20 = (long)uVar18 >> 3;
LAB_00188ee2:
            pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8
            ;
          }
          else {
            if (7 < uVar18) {
              uVar20 = uVar18 >> 3;
              goto LAB_00188ee2;
            }
            pvVar22 = pvVar22 + 1;
          }
          iVar12 = util::variant::GetInt(pvVar22);
          bVar8 = iVar10 <= iVar12;
          goto LAB_0018872d;
        }
        if ((long)uVar18 < 0) {
LAB_00188b9a:
          pvVar22 = ppvVar4[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_00188b9a;
        }
        iVar12 = util::variant::GetInt(pvVar22);
        bVar8 = iVar12 == iVar10;
        goto LAB_0018872d;
      }
      iVar10 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar10 == 0) {
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 6;
        uVar18 = lVar19 + 1;
        if (lVar19 < -1) {
          uVar20 = (long)uVar18 >> 3;
LAB_00188c2e:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else {
          if (7 < uVar18) {
            uVar20 = uVar18 >> 3;
            goto LAB_00188c2e;
          }
          pvVar22 = pvVar22 + 1;
        }
        util::variant::GetString_abi_cxx11_((string *)local_1a0,pvVar22);
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar18 = lVar19 >> 6;
        if ((long)uVar18 < 0) {
          uVar20 = lVar19 >> 9;
LAB_00188c87:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_00188c87;
        }
        util::variant::GetString_abi_cxx11_(&local_180,pvVar22);
        pbVar23 = (_Elt_pointer)local_150;
        local_160[0] = pbVar23;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"=","");
        __l._M_len = 3;
        __l._M_array = (iterator)local_1a0;
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::deque(&local_c0,__l,&local_1c1);
        bVar8 = rpn_char_eval(&local_c0,this->character);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque(&local_c0);
        lVar19 = -0x60;
        do {
          if (pbVar23 != (_Elt_pointer)pbVar23[-1].field_2._M_allocated_capacity) {
            operator_delete((_Elt_pointer)pbVar23[-1].field_2._M_allocated_capacity,
                            (ulong)((pbVar23->_M_dataplus)._M_p + 1));
          }
          pbVar23 = pbVar23 + -1;
          lVar19 = lVar19 + 0x20;
        } while (lVar19 != 0);
        goto LAB_0018872d;
      }
      iVar10 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar10 == 0) {
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 6;
        uVar18 = lVar19 + 1;
        if (lVar19 < -1) {
          uVar20 = (long)uVar18 >> 3;
LAB_00188d8e:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else {
          if (7 < uVar18) {
            uVar20 = uVar18 >> 3;
            goto LAB_00188d8e;
          }
          pvVar22 = pvVar22 + 1;
        }
        util::variant::GetString_abi_cxx11_((string *)local_1a0,pvVar22);
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar18 = lVar19 >> 6;
        if ((long)uVar18 < 0) {
          uVar20 = lVar19 >> 9;
LAB_00188de7:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_00188de7;
        }
        util::variant::GetString_abi_cxx11_(&local_180,pvVar22);
        pbVar23 = (_Elt_pointer)local_150;
        local_160[0] = pbVar23;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"=","");
        __l_00._M_len = 3;
        __l_00._M_array = (iterator)local_1a0;
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::deque(&local_c0,__l_00,&local_1c1);
        bVar8 = rpn_char_eval(&local_c0,this->character);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque(&local_c0);
        lVar19 = -0x60;
        do {
          if (pbVar23 != (_Elt_pointer)pbVar23[-1].field_2._M_allocated_capacity) {
            operator_delete((_Elt_pointer)pbVar23[-1].field_2._M_allocated_capacity,
                            (ulong)((pbVar23->_M_dataplus)._M_p + 1));
          }
          pbVar23 = pbVar23 + -1;
          lVar19 = lVar19 + 0x20;
        } while (lVar19 != 0);
        goto LAB_0018872d;
      }
      iVar10 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar10 == 0) {
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 6;
        uVar18 = lVar19 + 1;
        if (lVar19 < -1) {
          uVar20 = (long)uVar18 >> 3;
LAB_00188f0c:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else {
          if (7 < uVar18) {
            uVar20 = uVar18 >> 3;
            goto LAB_00188f0c;
          }
          pvVar22 = pvVar22 + 1;
        }
        util::variant::GetString_abi_cxx11_((string *)local_1a0,pvVar22);
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar18 = lVar19 >> 6;
        if ((long)uVar18 < 0) {
          uVar20 = lVar19 >> 9;
LAB_00188f65:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_00188f65;
        }
        util::variant::GetString_abi_cxx11_(&local_180,pvVar22);
        pbVar23 = (_Elt_pointer)local_150;
        local_160[0] = pbVar23;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_160,">","");
        __l_01._M_len = 3;
        __l_01._M_array = (iterator)local_1a0;
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::deque(&local_c0,__l_01,&local_1c1);
        bVar8 = rpn_char_eval(&local_c0,this->character);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque(&local_c0);
        lVar19 = -0x60;
        do {
          if (pbVar23 != (_Elt_pointer)pbVar23[-1].field_2._M_allocated_capacity) {
            operator_delete((_Elt_pointer)pbVar23[-1].field_2._M_allocated_capacity,
                            (ulong)((pbVar23->_M_dataplus)._M_p + 1));
          }
          pbVar23 = pbVar23 + -1;
          lVar19 = lVar19 + 0x20;
        } while (lVar19 != 0);
        goto LAB_0018872d;
      }
      iVar10 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar10 == 0) {
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 6;
        uVar18 = lVar19 + 1;
        if (lVar19 < -1) {
          uVar20 = (long)uVar18 >> 3;
LAB_0018905b:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else {
          if (7 < uVar18) {
            uVar20 = uVar18 >> 3;
            goto LAB_0018905b;
          }
          pvVar22 = pvVar22 + 1;
        }
        util::variant::GetString_abi_cxx11_((string *)local_1a0,pvVar22);
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar18 = lVar19 >> 6;
        if ((long)uVar18 < 0) {
          uVar20 = lVar19 >> 9;
LAB_001890b4:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_001890b4;
        }
        util::variant::GetString_abi_cxx11_(&local_180,pvVar22);
        pbVar23 = (_Elt_pointer)local_150;
        local_160[0] = pbVar23;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"<","");
        __l_02._M_len = 3;
        __l_02._M_array = (iterator)local_1a0;
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::deque(&local_c0,__l_02,&local_1c1);
        bVar8 = rpn_char_eval(&local_c0,this->character);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque(&local_c0);
        lVar19 = -0x60;
        do {
          if (pbVar23 != (_Elt_pointer)pbVar23[-1].field_2._M_allocated_capacity) {
            operator_delete((_Elt_pointer)pbVar23[-1].field_2._M_allocated_capacity,
                            (ulong)((pbVar23->_M_dataplus)._M_p + 1));
          }
          pbVar23 = pbVar23 + -1;
          lVar19 = lVar19 + 0x20;
        } while (lVar19 != 0);
        goto LAB_0018872d;
      }
      iVar10 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar10 == 0) {
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 6;
        uVar18 = lVar19 + 1;
        if (lVar19 < -1) {
          uVar20 = (long)uVar18 >> 3;
LAB_00189163:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else {
          if (7 < uVar18) {
            uVar20 = uVar18 >> 3;
            goto LAB_00189163;
          }
          pvVar22 = pvVar22 + 1;
        }
        util::variant::GetString_abi_cxx11_((string *)local_1a0,pvVar22);
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar18 = lVar19 >> 6;
        if ((long)uVar18 < 0) {
          uVar20 = lVar19 >> 9;
LAB_001891bc:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_001891bc;
        }
        util::variant::GetString_abi_cxx11_(&local_180,pvVar22);
        local_160[0] = (_Elt_pointer)local_150;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"gte","");
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 6;
        uVar18 = lVar19 + 2;
        if (lVar19 < -2) {
          uVar20 = (long)uVar18 >> 3;
LAB_0018924b:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else {
          if (7 < uVar18) {
            uVar20 = uVar18 >> 3;
            goto LAB_0018924b;
          }
          pvVar22 = pvVar22 + 2;
        }
        util::variant::GetString_abi_cxx11_((string *)(local_150 + 0x10),pvVar22);
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar18 = lVar19 >> 6;
        if ((long)uVar18 < 0) {
          uVar20 = lVar19 >> 9;
LAB_001892a2:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_001892a2;
        }
        util::variant::GetString_abi_cxx11_(&local_120,pvVar22);
        local_100[0] = local_f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"lte","");
        plVar24 = local_d0;
        local_e0[0] = plVar24;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"and","");
        __l_03._M_len = 7;
        __l_03._M_array = (iterator)local_1a0;
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::deque(&local_c0,__l_03,&local_1c1);
        bVar8 = rpn_char_eval(&local_c0,this->character);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque(&local_c0);
        lVar19 = -0xe0;
        do {
          if (plVar24 != (long *)plVar24[-2]) {
            operator_delete((long *)plVar24[-2],*plVar24 + 1);
          }
          plVar24 = plVar24 + -4;
          lVar19 = lVar19 + 0x20;
        } while (lVar19 != 0);
        goto LAB_0018872d;
      }
      iVar10 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar10 == 0) {
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar18 = lVar19 >> 6;
        if ((long)uVar18 < 0) {
          uVar20 = lVar19 >> 9;
LAB_0018937e:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_0018937e;
        }
        util::variant::GetString_abi_cxx11_(&local_50,pvVar22);
        util::rpn_parse((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_1a0,&local_50);
        bVar8 = rpn_char_eval((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_1a0,this->character);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1a0);
        local_1a0._16_8_ = local_50.field_2._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0018872d;
      }
      else {
        iVar10 = std::__cxx11::string::compare((char *)local_1c0);
        if (iVar10 != 0) goto LAB_00187fcb;
        pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar19 = (long)pvVar22 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar18 = lVar19 >> 6;
        if ((long)uVar18 < 0) {
          uVar20 = lVar19 >> 9;
LAB_001893f3:
          pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
        }
        else if (7 < uVar18) {
          uVar20 = uVar18 >> 3;
          goto LAB_001893f3;
        }
        util::variant::GetString_abi_cxx11_(&local_70,pvVar22);
        util::rpn_parse_v2((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_1a0,&local_70);
        bVar8 = rpn_char_eval((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_1a0,this->character);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1a0);
        local_1a0._16_8_ = local_70.field_2._M_allocated_capacity;
        local_50._M_dataplus._M_p = local_70._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0018872d;
      }
      goto LAB_001880c3;
    }
    pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    lVar19 = (long)pvVar22 -
             (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_first;
    uVar18 = lVar19 >> 6;
    if ((long)uVar18 < 0) {
      uVar20 = lVar19 >> 9;
LAB_0018811f:
      pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
    }
    else if (7 < uVar18) {
      uVar20 = uVar18 >> 3;
      goto LAB_0018811f;
    }
    sVar9 = this->character->map->id;
    iVar10 = util::variant::GetInt(pvVar22);
    if (iVar10 != sVar9) {
LAB_00188637:
      bVar8 = false;
      goto LAB_0018872d;
    }
    pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    lVar19 = (long)pvVar22 -
             (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_first >> 6;
    uVar18 = lVar19 + 1;
    if (lVar19 < -1) {
      uVar20 = (long)uVar18 >> 3;
LAB_001882ae:
      pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
    }
    else {
      if (7 < uVar18) {
        uVar20 = uVar18 >> 3;
        goto LAB_001882ae;
      }
      pvVar22 = pvVar22 + 1;
    }
    bVar1 = this->character->x;
    uVar11 = util::variant::GetInt(pvVar22);
    if (uVar11 != bVar1) goto LAB_00188637;
    pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    lVar19 = (long)pvVar22 -
             (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_first >> 6;
    uVar18 = lVar19 + 2;
    if (lVar19 < -2) {
      uVar20 = (long)uVar18 >> 3;
LAB_001883f8:
      pvVar22 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node[uVar20] + uVar18 + uVar20 * -8;
    }
    else {
      if (7 < uVar18) {
        uVar20 = uVar18 >> 3;
        goto LAB_001883f8;
      }
      pvVar22 = pvVar22 + 2;
    }
    uVar21 = (uint)this->character->y;
    uVar11 = util::variant::GetInt(pvVar22);
  }
LAB_00188081:
  bVar8 = uVar11 == uVar21;
LAB_0018872d:
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  return bVar8;
}

Assistant:

bool Quest_Context::CheckRule(const EOPlus::Expression& expr)
{
	if (this->quest->Disabled())
		return false;

	std::string function_name = expr.function;

	if (function_name == "always")
	{
		return true;
	}
	else if (function_name == "donedaily")
	{
		if (this->progress["d"] == quest_day())
		{
			return this->progress["c"] >= int(expr.args[0]);
		}
		else
		{
			this->progress["d"] = quest_day();
			this->progress["c"] = 0;
			return false;
		}
	}
	else if (function_name == "entermap")
	{
		return this->character->map->id == int(expr.args[0]);
	}
	else if (function_name == "entercoord")
	{
		return this->character->map->id == int(expr.args[0])
		    && this->character->x == int(expr.args[1])
		    && this->character->y == int(expr.args[2]);
	}
	else if (function_name == "leavemap")
	{
		return this->character->map->id != int(expr.args[0]);
	}
	else if (function_name == "leavecoord")
	{
		return this->character->map->id != int(expr.args[0])
		    || this->character->x != int(expr.args[1])
		    || this->character->y != int(expr.args[2]);
	}
	else if (function_name == "gotitems")
	{
		return this->character->HasItem(int(expr.args[0])) >= (expr.args.size() >= 2 ? int(expr.args[1]) : 1);
	}
	else if (function_name == "lostitems")
	{
		return this->character->HasItem(int(expr.args[0])) < (expr.args.size() >= 2 ? int(expr.args[1]) : 1);
	}
	else if (function_name == "gotspell")
	{
		return this->character->HasSpell(int(expr.args[0]))
		    && (expr.args.size() < 2 || this->character->SpellLevel(int(expr.args[0])) >= int(expr.args[1]));
	}
	else if (function_name == "lostspell")
	{
		return !this->character->HasSpell(int(expr.args[0]));
	}
	else if (function_name == "isgender")
	{
		return this->character->gender == Gender(int(expr.args[0]));
	}
	else if (function_name == "isclass")
	{
		return this->character->clas == int(expr.args[0]);
	}
	else if (function_name == "israce")
	{
		return this->character->race == int(expr.args[0]);
	}
	else if (function_name == "iswearing")
	{
		return std::find(UTIL_CRANGE(this->character->paperdoll), int(expr.args[0])) != this->character->paperdoll.end();
	}
	else if (function_name == "citizenof")
	{
		return this->character->home == std::string(expr.args[0]);
	}
	else if (function_name == "rolled")
	{
		int roll = this->progress["r"];

		if (expr.args.size() < 2)
		{
			return roll == int(expr.args[0]);
		}
		else
		{
			return roll >= int(expr.args[0])
			    && roll <= int(expr.args[1]);
		}
	}
	else if (function_name == "statis")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], "="}, character);
	}
	else if (function_name == "statnot")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], "="}, character);
	}
	else if (function_name == "statgreater")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], ">"}, character);
	}
	else if (function_name == "statless")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], "<"}, character);
	}
	else if (function_name == "statbetween")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], "gte", expr.args[2], expr.args[0], "lte", "and"}, character);
	}
	else if (function_name == "statrpn")
	{
		return rpn_char_eval(util::rpn_parse(expr.args[0]), character);
	}
	else if (function_name == "stateval")
	{
		return rpn_char_eval(util::rpn_parse_v2(expr.args[0]), character);
	}

	return false;
}